

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int theta_prune(saucy *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int irep;
  int rep;
  int label;
  int start;
  saucy *s_local;
  
  iVar1 = s->start[s->lev];
  iVar2 = find_representative(s->indmin,s->theta);
  do {
    if (s->kanctar == 0) {
      return -1;
    }
    iVar4 = s->kanctar + -1;
    s->kanctar = iVar4;
    iVar4 = s->anctar[iVar4];
    iVar3 = find_representative(iVar4,s->theta);
  } while ((iVar3 != iVar4) || (iVar3 == iVar2));
  return (s->right).unlab[iVar4] - iVar1;
}

Assistant:

static int
theta_prune(struct saucy *s)
{
    int start = s->start[s->lev];
    int label, rep, irep;

    irep = find_representative(s->indmin, s->theta);
    while (s->kanctar) {
        label = s->anctar[--s->kanctar];
        rep = find_representative(label, s->theta);
        if (rep == label && rep != irep) {
            return s->right.unlab[label] - start;
        }
    }
    return -1;
}